

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_HTMLparser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  htmlDocPtr pxVar23;
  long lVar24;
  htmlParserCtxtPtr pxVar25;
  xmlDocPtr pxVar26;
  xmlParserCtxtPtr pxVar27;
  ulong uVar28;
  ulong uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 extraout_RDX;
  int n_options;
  uint uVar32;
  ulong *puVar33;
  uint *puVar34;
  int n_legacy;
  uint uVar35;
  int iVar36;
  undefined8 uVar37;
  int *piVar38;
  ulong uVar39;
  undefined *puVar40;
  int test_ret_13;
  int iVar41;
  int test_ret_14;
  undefined4 *puVar42;
  undefined8 *puVar43;
  char *pcVar44;
  ulong uVar45;
  int test_ret_10;
  int iVar46;
  int *piVar47;
  int n_name;
  uint uVar48;
  undefined4 uVar49;
  uint uVar50;
  bool bVar51;
  int test_ret_1;
  int test_ret_8;
  int test_ret;
  int test_ret_4;
  int test_ret_5;
  int test_ret_3;
  int test_ret_20;
  int test_ret_21;
  int test_ret_2;
  int test_ret_6;
  int local_8c;
  int local_80;
  int local_74;
  int local_64;
  int local_50;
  int local_3c;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 37 of 43 functions ...");
  }
  iVar36 = 0;
  uVar48 = 0;
  do {
    puVar42 = &DAT_00157174;
    uVar28 = 0;
    do {
      iVar1 = xmlMemBlocks();
      if (uVar48 < 4) {
        uVar29 = (&DAT_00159d60)[uVar48];
      }
      else {
        uVar29 = 0;
      }
      uVar49 = 0xffffffff;
      uVar35 = (uint)uVar28;
      if (uVar35 < 4) {
        uVar49 = *puVar42;
      }
      htmlAttrAllowed(0,uVar29,uVar49);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar2 - iVar1));
        iVar36 = iVar36 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
        uVar29 = uVar28;
      }
      uVar35 = uVar35 + 1;
      uVar28 = (ulong)uVar35;
      puVar42 = puVar42 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  local_8c = 0;
  uVar48 = 0;
  do {
    puVar33 = &DAT_00159d60;
    uVar35 = 0;
    do {
      iVar2 = (int)uVar29;
      iVar1 = xmlMemBlocks();
      pxVar23 = gen_htmlDocPtr(uVar48,iVar2);
      if (uVar35 < 4) {
        uVar29 = *puVar33;
      }
      else {
        uVar29 = 0;
      }
      htmlAutoCloseTag(pxVar23,uVar29,0);
      call_tests = call_tests + 1;
      if (((pxVar23 != (htmlDocPtr)0x0) && (api_doc != pxVar23)) && (pxVar23->doc != api_doc)) {
        xmlFreeDoc(pxVar23);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar2 - iVar1));
        local_8c = local_8c + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        uVar29 = 0;
        printf(" %d");
        putchar(10);
      }
      uVar35 = uVar35 + 1;
      puVar33 = puVar33 + 1;
    } while (uVar35 != 5);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar48 = 0;
  do {
    puVar43 = &DAT_00159d48;
    uVar35 = 0;
    do {
      iVar2 = xmlMemBlocks();
      if (uVar48 < 5) {
        puVar40 = (&PTR_anon_var_dwarf_677_00159d20)[uVar48];
      }
      else {
        puVar40 = (undefined *)0x0;
      }
      if (uVar35 < 3) {
        uVar37 = *puVar43;
      }
      else {
        uVar37 = 0;
      }
      lVar24 = htmlCreateFileParserCtxt(puVar40,uVar37);
      if (lVar24 != 0) {
        htmlFreeParserCtxt();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateFileParserCtxt",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
      }
      uVar35 = uVar35 + 1;
      puVar43 = puVar43 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 6);
  function_tests = function_tests + 1;
  uVar48 = 0;
  local_64 = 0;
  do {
    piVar47 = &DAT_00157174;
    uVar35 = 0;
    do {
      iVar2 = xmlMemBlocks();
      if (uVar48 == 0) {
        bVar51 = false;
        pcVar44 = "foo";
      }
      else if (uVar48 == 2) {
        bVar51 = false;
        pcVar44 = "test/ent2";
      }
      else if (uVar48 == 1) {
        bVar51 = false;
        pcVar44 = "<foo/>";
      }
      else {
        bVar51 = true;
        pcVar44 = (char *)0x0;
      }
      iVar3 = -1;
      if (uVar35 < 4) {
        iVar3 = *piVar47;
      }
      if ((!bVar51) && (iVar4 = xmlStrlen(pcVar44), iVar4 < iVar3)) {
        iVar3 = 0;
      }
      lVar24 = htmlCreateMemoryParserCtxt(pcVar44,iVar3);
      if (lVar24 != 0) {
        htmlFreeParserCtxt(lVar24);
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",(ulong)(uint)(iVar3 - iVar2))
        ;
        local_64 = local_64 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d",(ulong)uVar35);
        putchar(10);
      }
      uVar35 = uVar35 + 1;
      piVar47 = piVar47 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  local_74 = 0;
  iVar2 = 0;
  do {
    iVar3 = 0;
    do {
      uVar28 = 0;
      do {
        uVar48 = 0;
        do {
          piVar47 = (int *)0x0;
          puVar42 = &DAT_0014b234;
          do {
            iVar4 = xmlMemBlocks();
            piVar38 = &call_tests;
            if (iVar2 != 0) {
              if (iVar2 == 1) {
                piVar38 = (int *)0xffffffffffffffff;
              }
              else {
                piVar38 = (int *)0x0;
              }
            }
            if (iVar3 == 0) {
              bVar51 = false;
              pcVar44 = "foo";
            }
            else if (iVar3 == 2) {
              bVar51 = false;
              pcVar44 = "test/ent2";
            }
            else if (iVar3 == 1) {
              bVar51 = false;
              pcVar44 = "<foo/>";
            }
            else {
              bVar51 = true;
              pcVar44 = (char *)0x0;
            }
            iVar6 = -1;
            if ((uint)uVar28 < 4) {
              iVar6 = (&DAT_00157174)[uVar28];
            }
            if (uVar48 < 5) {
              puVar40 = (&PTR_anon_var_dwarf_677_00159d20)[uVar48];
            }
            else {
              puVar40 = (undefined *)0x0;
            }
            uVar49 = 0xffffffff;
            uVar35 = (uint)piVar47;
            if (uVar35 < 3) {
              uVar49 = *puVar42;
            }
            if ((!bVar51) && (iVar5 = xmlStrlen(pcVar44), iVar5 < iVar6)) {
              iVar6 = 0;
            }
            lVar24 = htmlCreatePushParserCtxt(0,piVar38,pcVar44,iVar6,puVar40,uVar49);
            if (lVar24 != 0) {
              htmlFreeParserCtxt(lVar24);
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar4 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                     (ulong)(uint)(iVar6 - iVar4));
              local_74 = local_74 + 1;
              printf(" %d",0);
              printf(" %d",iVar2);
              printf(" %d",iVar3);
              printf(" %d",uVar28);
              printf(" %d",(ulong)uVar48);
              printf(" %d");
              putchar(10);
              piVar38 = piVar47;
            }
            uVar35 = uVar35 + 1;
            piVar47 = (int *)(ulong)uVar35;
            puVar42 = puVar42 + 1;
          } while (uVar35 != 4);
          uVar48 = uVar48 + 1;
        } while (uVar48 != 6);
        uVar48 = (uint)uVar28 + 1;
        uVar28 = (ulong)uVar48;
      } while (uVar48 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 4);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar3 = 0;
  do {
    iVar6 = (int)piVar38;
    iVar4 = xmlMemBlocks();
    pxVar25 = gen_htmlParserCtxtPtr(iVar3,iVar6);
    piVar38 = (int *)0x0;
    pxVar26 = (xmlDocPtr)htmlCtxtParseDocument(pxVar25);
    if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc)) {
      xmlFreeDoc(pxVar26);
    }
    call_tests = call_tests + 1;
    if (pxVar25 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar25);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar4 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtParseDocument",(ulong)(uint)(iVar6 - iVar4));
      iVar2 = iVar2 + 1;
      printf(" %d");
      piVar38 = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  local_38 = &DAT_00159d60;
  local_3c = 0;
  uVar48 = 0;
  do {
    uVar35 = 0;
    do {
      uVar28 = 0;
      do {
        uVar29 = 0;
        do {
          piVar47 = (int *)0x0;
          puVar42 = &DAT_00157174;
          do {
            iVar4 = (int)piVar38;
            iVar3 = xmlMemBlocks();
            pxVar25 = gen_htmlParserCtxtPtr(uVar48,iVar4);
            if (uVar35 < 4) {
              piVar38 = (int *)(&DAT_00159d60)[uVar35];
            }
            else {
              piVar38 = (int *)0x0;
            }
            if ((uint)uVar28 < 3) {
              uVar37 = (&DAT_00159d48)[uVar28];
            }
            else {
              uVar37 = 0;
            }
            if ((uint)uVar29 < 3) {
              uVar30 = (&DAT_00159d48)[uVar29];
            }
            else {
              uVar30 = 0;
            }
            uVar49 = 0xffffffff;
            uVar32 = (uint)piVar47;
            if (uVar32 < 4) {
              uVar49 = *puVar42;
            }
            pxVar26 = (xmlDocPtr)htmlCtxtReadDoc(pxVar25,piVar38,uVar37,uVar30,uVar49);
            if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc))
            {
              xmlFreeDoc(pxVar26);
            }
            call_tests = call_tests + 1;
            if (pxVar25 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt(pxVar25);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar4 - iVar3));
              local_3c = local_3c + 1;
              printf(" %d",(ulong)uVar48);
              printf(" %d",(ulong)uVar35);
              printf(" %d",uVar28);
              printf(" %d",uVar29);
              printf(" %d");
              putchar(10);
              piVar38 = piVar47;
            }
            uVar32 = uVar32 + 1;
            piVar47 = (int *)(ulong)uVar32;
            puVar42 = puVar42 + 1;
          } while (uVar32 != 4);
          uVar32 = (uint)uVar29 + 1;
          uVar29 = (ulong)uVar32;
        } while (uVar32 != 4);
        uVar32 = (uint)uVar28 + 1;
        uVar28 = (ulong)uVar32;
      } while (uVar32 != 4);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 5);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar36 = local_8c + iVar36 + iVar1 + local_64 + local_74;
  iVar1 = 0;
  do {
    uVar48 = 0;
    do {
      uVar28 = 0;
      do {
        puVar42 = &DAT_00157174;
        uVar35 = 0;
        do {
          pxVar25 = gen_htmlParserCtxtPtr(iVar1,(int)piVar38);
          if (uVar48 < 7) {
            piVar38 = (int *)(&DAT_00159d80)[uVar48];
          }
          else {
            piVar38 = (int *)0x0;
          }
          if ((uint)uVar28 < 3) {
            uVar37 = (&DAT_00159d48)[uVar28];
          }
          else {
            uVar37 = 0;
          }
          uVar49 = 0xffffffff;
          if (uVar35 < 4) {
            uVar49 = *puVar42;
          }
          pxVar26 = (xmlDocPtr)htmlCtxtReadFile(pxVar25,piVar38,uVar37,uVar49);
          if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc)) {
            xmlFreeDoc(pxVar26);
          }
          call_tests = call_tests + 1;
          if (pxVar25 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar25);
          }
          xmlResetLastError();
          uVar35 = uVar35 + 1;
          puVar42 = puVar42 + 1;
        } while (uVar35 != 4);
        uVar35 = (uint)uVar28 + 1;
        uVar28 = (ulong)uVar35;
      } while (uVar35 != 4);
      uVar48 = uVar48 + 1;
    } while (uVar48 != 8);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 3);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar48 = 0;
  do {
    uVar35 = 0;
    do {
      uVar32 = 0;
      do {
        uVar28 = 0;
        do {
          uVar7 = 0;
          do {
            piVar47 = (int *)0x0;
            do {
              iVar3 = (int)piVar38;
              iVar1 = xmlMemBlocks();
              pxVar25 = gen_htmlParserCtxtPtr(uVar48,iVar3);
              if (uVar35 == 0) {
                pcVar44 = "foo";
LAB_001181cf:
                bVar51 = false;
              }
              else {
                if (uVar35 == 2) {
                  pcVar44 = "test/ent2";
                  goto LAB_001181cf;
                }
                if (uVar35 == 1) {
                  bVar51 = false;
                  pcVar44 = "<foo/>";
                }
                else {
                  bVar51 = true;
                  pcVar44 = (char *)0x0;
                }
              }
              iVar3 = -1;
              if (uVar32 < 4) {
                iVar3 = (&DAT_00157174)[uVar32];
              }
              if ((uint)uVar28 < 3) {
                uVar37 = (&DAT_00159d48)[uVar28];
              }
              else {
                uVar37 = 0;
              }
              iVar4 = (int)piVar47;
              if ((!bVar51) && (iVar6 = xmlStrlen(pcVar44), iVar6 < iVar3)) {
                iVar3 = 0;
              }
              pxVar26 = (xmlDocPtr)htmlCtxtReadMemory(pxVar25,pcVar44,iVar3,uVar37);
              if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar26);
              }
              call_tests = call_tests + 1;
              if (pxVar25 != (htmlParserCtxtPtr)0x0) {
                htmlFreeParserCtxt(pxVar25);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              piVar38 = (int *)pcVar44;
              if (iVar1 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCtxtReadMemory",(ulong)(uint)(iVar3 - iVar1))
                ;
                local_64 = local_64 + 1;
                printf(" %d",(ulong)uVar48);
                printf(" %d",(ulong)uVar35);
                printf(" %d",(ulong)uVar32);
                printf(" %d",uVar28);
                printf(" %d",(ulong)uVar7);
                printf(" %d");
                putchar(10);
                piVar38 = piVar47;
              }
              uVar50 = iVar4 + 1;
              piVar47 = (int *)(ulong)uVar50;
            } while (uVar50 != 4);
            uVar7 = uVar7 + 1;
          } while (uVar7 != 4);
          uVar7 = (uint)uVar28 + 1;
          uVar28 = (ulong)uVar7;
        } while (uVar7 != 4);
        uVar32 = uVar32 + 1;
      } while (uVar32 != 4);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar1 = 0;
  do {
    iVar3 = xmlMemBlocks();
    pxVar25 = gen_htmlParserCtxtPtr(uVar48,(int)piVar38);
    htmlCtxtReset(pxVar25);
    call_tests = call_tests + 1;
    if (pxVar25 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar25);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar4 - iVar3));
      iVar1 = iVar1 + 1;
      piVar38 = (int *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar48 = 0;
  do {
    puVar34 = &DAT_00157174;
    piVar47 = (int *)0x0;
    do {
      iVar6 = (int)piVar38;
      iVar4 = xmlMemBlocks();
      pxVar27 = gen_xmlParserCtxtPtr(uVar48,iVar6);
      piVar38 = (int *)0xffffffff;
      uVar35 = (uint)piVar47;
      if (uVar35 < 4) {
        piVar38 = (int *)(ulong)*puVar34;
      }
      htmlCtxtSetOptions(pxVar27);
      call_tests = call_tests + 1;
      if (pxVar27 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar27);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar4 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtSetOptions",(ulong)(uint)(iVar6 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
        piVar38 = piVar47;
      }
      uVar35 = uVar35 + 1;
      piVar47 = (int *)(ulong)uVar35;
      puVar34 = puVar34 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar48 = 0;
  do {
    puVar34 = &DAT_00157174;
    piVar47 = (int *)0x0;
    do {
      iVar5 = (int)piVar38;
      iVar6 = xmlMemBlocks();
      pxVar25 = gen_htmlParserCtxtPtr(uVar48,iVar5);
      piVar38 = (int *)0xffffffff;
      uVar35 = (uint)piVar47;
      if (uVar35 < 4) {
        piVar38 = (int *)(ulong)*puVar34;
      }
      htmlCtxtUseOptions(pxVar25);
      call_tests = call_tests + 1;
      if (pxVar25 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt(pxVar25);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar6 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar5 - iVar6));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
        piVar38 = piVar47;
      }
      uVar35 = uVar35 + 1;
      piVar47 = (int *)(ulong)uVar35;
      puVar34 = puVar34 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar6 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar37 = *local_38;
    }
    else {
      uVar37 = 0;
    }
    htmlElementAllowedHere(0,uVar37);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar5 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar8 - iVar5));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    local_38 = local_38 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  htmlElementStatusHere(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar5 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlElementStatusHere",(ulong)(uint)(iVar9 - iVar5));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar28 = 0;
  do {
    uVar29 = 0;
    iVar41 = (int)uVar28;
    uVar45 = 0;
    if (iVar41 == 0) {
      uVar45 = 0x15c404;
    }
    do {
      iVar12 = (int)uVar29;
      uVar37 = 0;
      if (iVar12 == 0) {
        uVar37 = 0x15c40c;
      }
      puVar42 = &DAT_00157174;
      uVar48 = 0;
      do {
        iVar10 = xmlMemBlocks();
        uVar49 = 0xffffffff;
        if (uVar48 < 4) {
          uVar49 = *puVar42;
        }
        uVar39 = uVar45;
        htmlEncodeEntities(0,uVar45,0,uVar37,uVar49);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar11 - iVar10));
          iVar9 = iVar9 + 1;
          printf(" %d",0);
          printf(" %d",uVar28);
          printf(" %d",0);
          printf(" %d",uVar29);
          uVar39 = (ulong)uVar48;
          printf(" %d");
          putchar(10);
        }
        uVar48 = uVar48 + 1;
        puVar42 = puVar42 + 1;
      } while (uVar48 != 4);
      uVar29 = (ulong)(iVar12 + 1);
    } while (iVar12 == 0);
    uVar28 = (ulong)(iVar41 + 1);
  } while (iVar41 == 0);
  function_tests = function_tests + 1;
  puVar43 = &DAT_00159d60;
  uVar48 = 0;
  iVar41 = 0;
  do {
    iVar12 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar37 = *puVar43;
    }
    else {
      uVar37 = 0;
    }
    htmlEntityLookup(uVar37);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar12 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar10 - iVar12));
      iVar41 = iVar41 + 1;
      uVar39 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar43 = puVar43 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  puVar42 = &DAT_0014b1f8;
  uVar48 = 0;
  iVar12 = 0;
  do {
    iVar10 = xmlMemBlocks();
    uVar49 = 0xffffffff;
    if (uVar48 < 3) {
      uVar49 = *puVar42;
    }
    htmlEntityValueLookup(uVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar11 - iVar10));
      iVar12 = iVar12 + 1;
      uVar39 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar42 = puVar42 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  puVar42 = &DAT_00157174;
  uVar48 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    uVar49 = 0xffffffff;
    if (uVar48 < 4) {
      uVar49 = *puVar42;
    }
    htmlHandleOmittedElem(uVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar11 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar13 - iVar11));
      iVar10 = iVar10 + 1;
      uVar39 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar42 = puVar42 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  htmlInitAutoClose();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar11 != iVar13) {
    iVar14 = xmlMemBlocks();
    uVar39 = (ulong)(uint)(iVar14 - iVar11);
    printf("Leak of %d blocks found in htmlInitAutoClose");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar46 = 0;
  iVar14 = 0;
  do {
    iVar16 = (int)uVar39;
    iVar15 = xmlMemBlocks();
    pxVar23 = gen_htmlDocPtr(iVar14,iVar16);
    uVar39 = 0;
    htmlIsAutoClosed(pxVar23);
    call_tests = call_tests + 1;
    if (((pxVar23 != (htmlDocPtr)0x0) && (api_doc != pxVar23)) && (pxVar23->doc != api_doc)) {
      xmlFreeDoc(pxVar23);
    }
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar16 - iVar15));
      iVar46 = iVar46 + 1;
      printf(" %d");
      uVar39 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != 3);
  function_tests = function_tests + 1;
  puVar43 = &DAT_00159d60;
  uVar48 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar37 = *puVar43;
    }
    else {
      uVar37 = 0;
    }
    htmlIsScriptAttribute(uVar37);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",(ulong)uVar48);
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar43 = puVar43 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  lVar24 = htmlNewParserCtxt();
  if (lVar24 != 0) {
    htmlFreeParserCtxt(lVar24);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    iVar17 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlNewParserCtxt",(ulong)(uint)(iVar17 - iVar15));
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    piVar47 = &call_tests;
    if (uVar48 != 0) {
      if (uVar48 == 1) {
        piVar47 = (int *)0xffffffffffffffff;
      }
      else {
        piVar47 = (int *)0x0;
      }
    }
    lVar24 = htmlNewSAXParserCtxt(0,piVar47);
    if (lVar24 != 0) {
      htmlFreeParserCtxt();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNewSAXParserCtxt",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar48);
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  puVar34 = &DAT_00157174;
  uVar48 = 0;
  local_74 = 0;
  do {
    iVar18 = xmlMemBlocks();
    pcVar44 = (char *)0xffffffff;
    if (uVar48 < 4) {
      pcVar44 = (char *)(ulong)*puVar34;
    }
    htmlNodeStatus(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar19 - iVar18));
      local_74 = local_74 + 1;
      printf(" %d",0);
      pcVar44 = (char *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar34 = puVar34 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    pxVar25 = gen_htmlParserCtxtPtr(uVar48,(int)pcVar44);
    htmlParseCharRef(pxVar25);
    call_tests = call_tests + 1;
    if (pxVar25 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar25);
    }
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      pcVar44 = (char *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  local_50 = 0;
  uVar48 = 0;
  do {
    iVar19 = 0;
    do {
      uVar35 = 0;
      do {
        puVar42 = &DAT_00157174;
        uVar32 = 0;
        do {
          iVar22 = (int)pcVar44;
          iVar20 = xmlMemBlocks();
          pxVar25 = gen_htmlParserCtxtPtr(uVar48,iVar22);
          if (iVar19 == 0) {
            pcVar44 = "foo";
LAB_00118e22:
            bVar51 = false;
          }
          else {
            if (iVar19 == 2) {
              pcVar44 = "test/ent2";
              goto LAB_00118e22;
            }
            if (iVar19 == 1) {
              bVar51 = false;
              pcVar44 = "<foo/>";
            }
            else {
              bVar51 = true;
              pcVar44 = (char *)0x0;
            }
          }
          uVar49 = 0xffffffff;
          iVar22 = -1;
          if (uVar35 < 4) {
            iVar22 = (&DAT_00157174)[uVar35];
          }
          if (uVar32 < 4) {
            uVar49 = *puVar42;
          }
          if ((!bVar51) && (iVar21 = xmlStrlen(pcVar44), iVar21 < iVar22)) {
            iVar22 = 0;
          }
          htmlParseChunk(pxVar25,pcVar44,iVar22,uVar49);
          if (pxVar25 == (htmlParserCtxtPtr)0x0) {
            call_tests = call_tests + 1;
          }
          else {
            xmlFreeDoc(pxVar25->myDoc);
            pxVar25->myDoc = (xmlDocPtr)0x0;
            call_tests = call_tests + 1;
            htmlFreeParserCtxt(pxVar25);
          }
          xmlResetLastError();
          iVar22 = xmlMemBlocks();
          if (iVar20 != iVar22) {
            iVar22 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar22 - iVar20));
            local_50 = local_50 + 1;
            printf(" %d",(ulong)uVar48);
            printf(" %d",iVar19);
            printf(" %d",(ulong)uVar35);
            pcVar44 = (char *)(ulong)uVar32;
            printf(" %d");
            putchar(10);
          }
          uVar32 = uVar32 + 1;
          puVar42 = puVar42 + 1;
        } while (uVar32 != 4);
        uVar35 = uVar35 + 1;
      } while (uVar35 != 4);
      iVar19 = iVar19 + 1;
    } while (iVar19 != 4);
    uVar48 = uVar48 + 1;
    if (uVar48 == 3) {
      iVar36 = iVar36 + iVar2 + local_3c + local_64 + iVar1 + iVar3 + iVar4 + iVar6 +
               (uint)(iVar5 != iVar8) + iVar9 + iVar41 + iVar12 + iVar10 + (uint)(iVar11 != iVar13)
               + iVar46 + iVar14 + (uint)(iVar15 != iVar16) + iVar17 + local_74;
      function_tests = function_tests + 1;
      iVar1 = 0;
      uVar48 = 0;
      do {
        puVar33 = &DAT_00159d48;
        uVar35 = 0;
        do {
          iVar2 = xmlMemBlocks();
          if (uVar48 < 4) {
            uVar37 = (&DAT_00159d60)[uVar48];
          }
          else {
            uVar37 = 0;
          }
          if (uVar35 < 3) {
            uVar28 = *puVar33;
          }
          else {
            uVar28 = 0;
          }
          pxVar26 = (xmlDocPtr)htmlParseDoc(uVar37);
          if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc)) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar3 - iVar2));
            iVar1 = iVar1 + 1;
            printf(" %d",(ulong)uVar48);
            uVar28 = (ulong)uVar35;
            printf(" %d");
            putchar(10);
          }
          uVar35 = uVar35 + 1;
          puVar33 = puVar33 + 1;
        } while (uVar35 != 4);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 5);
      function_tests = function_tests + 1;
      uVar48 = 0;
      iVar2 = 0;
      do {
        iVar3 = xmlMemBlocks();
        pxVar25 = gen_htmlParserCtxtPtr(uVar48,(int)uVar28);
        htmlParseDocument(pxVar25);
        if (pxVar25 == (htmlParserCtxtPtr)0x0) {
          call_tests = call_tests + 1;
        }
        else {
          xmlFreeDoc(pxVar25->myDoc);
          pxVar25->myDoc = (xmlDocPtr)0x0;
          call_tests = call_tests + 1;
          htmlFreeParserCtxt(pxVar25);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar4 - iVar3));
          iVar2 = iVar2 + 1;
          uVar28 = (ulong)uVar48;
          printf(" %d");
          putchar(10);
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != 3);
      function_tests = function_tests + 1;
      uVar48 = 0;
      iVar3 = 0;
      do {
        iVar4 = xmlMemBlocks();
        pxVar25 = gen_htmlParserCtxtPtr(uVar48,(int)uVar28);
        htmlParseElement(pxVar25);
        call_tests = call_tests + 1;
        if (pxVar25 != (htmlParserCtxtPtr)0x0) {
          htmlFreeParserCtxt(pxVar25);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar4 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar6 - iVar4));
          iVar3 = iVar3 + 1;
          uVar28 = (ulong)uVar48;
          printf(" %d");
          putchar(10);
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != 3);
      function_tests = function_tests + 1;
      local_80 = 0;
      iVar4 = 0;
      do {
        iVar5 = (int)uVar28;
        iVar6 = xmlMemBlocks();
        pxVar25 = gen_htmlParserCtxtPtr(iVar4,iVar5);
        uVar28 = 0;
        htmlParseEntityRef(pxVar25);
        call_tests = call_tests + 1;
        if (pxVar25 != (htmlParserCtxtPtr)0x0) {
          htmlFreeParserCtxt(pxVar25);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar6 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar5 - iVar6));
          local_80 = local_80 + 1;
          printf(" %d");
          uVar28 = 0;
          printf(" %d");
          putchar(10);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != 3);
      function_tests = function_tests + 1;
      uVar48 = 0;
      do {
        puVar43 = &DAT_00159d48;
        uVar35 = 0;
        do {
          if (uVar48 < 7) {
            uVar37 = (&DAT_00159d80)[uVar48];
          }
          else {
            uVar37 = 0;
          }
          if (uVar35 < 3) {
            uVar30 = *puVar43;
          }
          else {
            uVar30 = 0;
          }
          pxVar26 = (xmlDocPtr)htmlParseFile(uVar37,uVar30);
          if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc)) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          uVar35 = uVar35 + 1;
          puVar43 = puVar43 + 1;
        } while (uVar35 != 4);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 8);
      function_tests = function_tests + 1;
      iVar4 = 0;
      uVar48 = 0;
      do {
        uVar28 = 0;
        do {
          uVar29 = 0;
          do {
            puVar42 = &DAT_00157174;
            uVar35 = 0;
            do {
              iVar6 = xmlMemBlocks();
              if (uVar48 < 4) {
                uVar37 = (&DAT_00159d60)[uVar48];
              }
              else {
                uVar37 = 0;
              }
              if ((uint)uVar28 < 3) {
                uVar30 = (&DAT_00159d48)[uVar28];
              }
              else {
                uVar30 = 0;
              }
              if ((uint)uVar29 < 3) {
                uVar31 = (&DAT_00159d48)[uVar29];
              }
              else {
                uVar31 = 0;
              }
              uVar49 = 0xffffffff;
              if (uVar35 < 4) {
                uVar49 = *puVar42;
              }
              pxVar26 = (xmlDocPtr)htmlReadDoc(uVar37,uVar30,uVar31,uVar49);
              if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc)
                 ) {
                xmlFreeDoc();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar6 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar5 - iVar6));
                iVar4 = iVar4 + 1;
                printf(" %d",(ulong)uVar48);
                printf(" %d",uVar28);
                printf(" %d",uVar29);
                printf(" %d");
                putchar(10);
              }
              uVar35 = uVar35 + 1;
              puVar42 = puVar42 + 1;
            } while (uVar35 != 4);
            uVar35 = (uint)uVar29 + 1;
            uVar29 = (ulong)uVar35;
          } while (uVar35 != 4);
          uVar35 = (uint)uVar28 + 1;
          uVar28 = (ulong)uVar35;
        } while (uVar35 != 4);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 5);
      function_tests = function_tests + 1;
      local_64 = 0;
      uVar48 = 0;
      do {
        uVar28 = 0;
        do {
          uVar35 = 0;
          puVar42 = &DAT_00157174;
          do {
            iVar6 = xmlMemBlocks();
            if (uVar48 < 7) {
              uVar37 = (&DAT_00159d80)[uVar48];
            }
            else {
              uVar37 = 0;
            }
            if ((uint)uVar28 < 3) {
              uVar30 = (&DAT_00159d48)[uVar28];
            }
            else {
              uVar30 = 0;
            }
            uVar49 = 0xffffffff;
            if (uVar35 < 4) {
              uVar49 = *puVar42;
            }
            pxVar26 = (xmlDocPtr)htmlReadFile(uVar37,uVar30,uVar49);
            if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc))
            {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar6 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar5 - iVar6));
              local_64 = local_64 + 1;
              printf(" %d",(ulong)uVar48);
              printf(" %d",uVar28);
              printf(" %d");
              putchar(10);
            }
            uVar35 = uVar35 + 1;
            puVar42 = puVar42 + 1;
          } while (uVar35 != 4);
          uVar35 = (uint)uVar28 + 1;
          uVar28 = (ulong)uVar35;
        } while (uVar35 != 4);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 8);
      function_tests = function_tests + 1;
      local_74 = 0;
      iVar6 = 0;
      do {
        uVar48 = 0;
        do {
          uVar35 = 0;
          do {
            uVar32 = 0;
            do {
              uVar28 = (ulong)uVar32;
              uVar29 = 0;
              puVar42 = &DAT_00157174;
              do {
                iVar5 = xmlMemBlocks();
                if (iVar6 == 0) {
                  pcVar44 = "foo";
LAB_001195a2:
                  bVar51 = false;
                }
                else {
                  if (iVar6 == 2) {
                    pcVar44 = "test/ent2";
                    goto LAB_001195a2;
                  }
                  if (iVar6 == 1) {
                    bVar51 = false;
                    pcVar44 = "<foo/>";
                  }
                  else {
                    bVar51 = true;
                    pcVar44 = (char *)0x0;
                  }
                }
                iVar8 = -1;
                if (uVar48 < 4) {
                  iVar8 = (&DAT_00157174)[uVar48];
                }
                if (uVar35 < 3) {
                  uVar37 = (&DAT_00159d48)[uVar35];
                }
                else {
                  uVar37 = 0;
                }
                if (uVar32 < 3) {
                  uVar30 = (&DAT_00159d48)[uVar28];
                }
                else {
                  uVar30 = 0;
                }
                uVar49 = 0xffffffff;
                if ((uint)uVar29 < 4) {
                  uVar49 = *puVar42;
                }
                if ((!bVar51) &&
                   (iVar9 = xmlStrlen(pcVar44,uVar28,extraout_RDX,uVar30), iVar9 < iVar8)) {
                  iVar8 = 0;
                }
                pxVar26 = (xmlDocPtr)htmlReadMemory(pcVar44,iVar8,uVar37,uVar30,uVar49);
                if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) &&
                   (pxVar26->doc != api_doc)) {
                  xmlFreeDoc();
                }
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar8 = xmlMemBlocks();
                if (iVar5 != iVar8) {
                  iVar8 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar8 - iVar5));
                  local_74 = local_74 + 1;
                  printf(" %d",iVar6);
                  printf(" %d",(ulong)uVar48);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",uVar28);
                  printf(" %d",uVar29);
                  putchar(10);
                }
                uVar7 = (uint)uVar29 + 1;
                uVar29 = (ulong)uVar7;
                puVar42 = puVar42 + 1;
              } while (uVar7 != 4);
              uVar32 = uVar32 + 1;
            } while (uVar32 != 4);
            uVar35 = uVar35 + 1;
          } while (uVar35 != 4);
          uVar48 = uVar48 + 1;
        } while (uVar48 != 4);
        iVar6 = iVar6 + 1;
        if (iVar6 == 4) {
          function_tests = function_tests + 1;
          iVar6 = 0;
          uVar48 = 0;
          do {
            uVar35 = 0;
            do {
              iVar5 = 0;
              do {
                iVar8 = xmlMemBlocks();
                if (uVar48 < 4) {
                  uVar37 = (&DAT_00159d60)[uVar48];
                }
                else {
                  uVar37 = 0;
                }
                if (uVar35 < 3) {
                  uVar30 = (&DAT_00159d48)[uVar35];
                }
                else {
                  uVar30 = 0;
                }
                piVar47 = &call_tests;
                if (iVar5 != 0) {
                  if (iVar5 == 1) {
                    piVar47 = (int *)0xffffffffffffffff;
                  }
                  else {
                    piVar47 = (int *)0x0;
                  }
                }
                pxVar26 = (xmlDocPtr)htmlSAXParseDoc(uVar37,uVar30,0,piVar47);
                if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) &&
                   (pxVar26->doc != api_doc)) {
                  xmlFreeDoc();
                }
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar9 = xmlMemBlocks();
                if (iVar8 != iVar9) {
                  iVar9 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar9 - iVar8));
                  iVar6 = iVar6 + 1;
                  printf(" %d",(ulong)uVar48);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",0);
                  printf(" %d");
                  putchar(10);
                }
                iVar5 = iVar5 + 1;
              } while (iVar5 != 3);
              uVar35 = uVar35 + 1;
            } while (uVar35 != 4);
            uVar48 = uVar48 + 1;
          } while (uVar48 != 5);
          function_tests = function_tests + 1;
          iVar5 = 0;
          uVar48 = 0;
          do {
            uVar35 = 0;
            do {
              iVar8 = 0;
              do {
                iVar9 = xmlMemBlocks();
                if (uVar48 < 7) {
                  uVar37 = (&DAT_00159d80)[uVar48];
                }
                else {
                  uVar37 = 0;
                }
                if (uVar35 < 3) {
                  uVar30 = (&DAT_00159d48)[uVar35];
                }
                else {
                  uVar30 = 0;
                }
                piVar47 = &call_tests;
                if (iVar8 != 0) {
                  if (iVar8 == 1) {
                    piVar47 = (int *)0xffffffffffffffff;
                  }
                  else {
                    piVar47 = (int *)0x0;
                  }
                }
                pxVar26 = (xmlDocPtr)htmlSAXParseFile(uVar37,uVar30,0,piVar47);
                if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) &&
                   (pxVar26->doc != api_doc)) {
                  xmlFreeDoc();
                }
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar41 = xmlMemBlocks();
                if (iVar9 != iVar41) {
                  iVar41 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar41 - iVar9)
                        );
                  iVar5 = iVar5 + 1;
                  printf(" %d",(ulong)uVar48);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",0);
                  printf(" %d");
                  putchar(10);
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 != 3);
              uVar35 = uVar35 + 1;
            } while (uVar35 != 4);
            uVar48 = uVar48 + 1;
          } while (uVar48 != 8);
          function_tests = function_tests + 1;
          iVar8 = 0;
          uVar48 = 0;
          do {
            uVar37 = 0;
            if (uVar48 == 0) {
              uVar37 = 0x15c404;
            }
            uVar35 = 0;
            do {
              iVar9 = xmlMemBlocks();
              uVar30 = 0;
              if (uVar35 == 0) {
                uVar30 = 0x15c40c;
              }
              htmlUTF8ToHtml(0,uVar37,0,uVar30);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar41 = xmlMemBlocks();
              if (iVar9 != iVar41) {
                iVar41 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlUTF8ToHtml",(ulong)(uint)(iVar41 - iVar9));
                iVar8 = iVar8 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar48);
                printf(" %d",0);
                printf(" %d",(ulong)uVar35);
                putchar(10);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 == 1);
            bVar51 = uVar48 == 0;
            uVar48 = uVar48 + 1;
          } while (bVar51);
          function_tests = function_tests + 1;
          uVar48 = iVar36 + iVar18 + local_50 + iVar1 + iVar2 + iVar3 + local_80 + iVar4 + local_64
                   + local_74 + iVar6 + iVar5 + iVar8;
          if (uVar48 != 0) {
            printf("Module HTMLparser: %d errors\n",(ulong)uVar48);
          }
          return uVar48;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 37 of 43 functions ...\n");
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateFileParserCtxt();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtParseDocument();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtSetOptions();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlInitAutoClose();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNewSAXParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();
    test_ret += test_htmlUTF8ToHtml();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}